

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::sync
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this)

{
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  char local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&this->field_0x20 != *(long *)&this->field_0x28) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&this->field_0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

int sync() override {
                if( pbase() != pptr() ) {
                    m_writer( std::string( pbase(), static_cast<std::string::size_type>( pptr() - pbase() ) ) );
                    setp( pbase(), epptr() );
                }
                return 0;
            }